

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void MutableS2ShapeIndex::TestAllEdges
               (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                *edges,InteriorTracker *tracker)

{
  FaceEdge *pFVar1;
  bool bVar2;
  reference ppCVar3;
  FaceEdge *face_edge;
  ClippedEdge *edge;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *__range1;
  InteriorTracker *tracker_local;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *edges_local;
  
  __end1 = std::
           vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
           ::begin(edges);
  edge = (ClippedEdge *)
         std::
         vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
         ::end(edges);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_*const_*,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
                                *)&edge);
    if (!bVar2) break;
    ppCVar3 = __gnu_cxx::
              __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_*const_*,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
              ::operator*(&__end1);
    pFVar1 = (*ppCVar3)->face_edge;
    if ((pFVar1->has_interior & 1U) != 0) {
      InteriorTracker::TestEdge(tracker,pFVar1->shape_id,&pFVar1->edge);
    }
    __gnu_cxx::
    __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_*const_*,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::TestAllEdges(const vector<const ClippedEdge*>& edges,
                                       InteriorTracker* tracker) {
  for (const ClippedEdge* edge : edges) {
    const FaceEdge* face_edge = edge->face_edge;
    if (face_edge->has_interior) {
      tracker->TestEdge(face_edge->shape_id, face_edge->edge);
    }
  }
}